

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void d68040_move16_pi_al(m68k_info *info)

{
  int data [2];
  int modes [2];
  uint local_18;
  uint local_14;
  int local_10 [2];
  
  local_18 = info->ir & 7;
  local_14 = read_imm_32(info);
  local_10[0] = 4;
  local_10[1] = 0x11;
  if ((info->type & 0x10) == 0) {
    d68000_invalid(info);
    return;
  }
  build_move16(info,(int *)&local_18,local_10);
  return;
}

Assistant:

static void d68040_move16_pi_al(m68k_info *info)
{
	int data[] = { info->ir & 7, read_imm_32(info) };
	int modes[] = { M68K_AM_REGI_ADDR_POST_INC, M68K_AM_ABSOLUTE_DATA_LONG };

	LIMIT_CPU_TYPES(info, M68040_PLUS);

	build_move16(info, data, modes);
}